

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_absolute_instructions.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_887c0::CpuAbsoluteTest_and_abs_sets_neg_clears_zero_Test::
~CpuAbsoluteTest_and_abs_sets_neg_clears_zero_Test
          (CpuAbsoluteTest_and_abs_sets_neg_clears_zero_Test *this)

{
  CpuAbsoluteTest_and_abs_sets_neg_clears_zero_Test *this_local;
  
  CpuAbsoluteTest::~CpuAbsoluteTest(&this->super_CpuAbsoluteTest);
  return;
}

Assistant:

TEST_F(CpuAbsoluteTest, and_abs_sets_neg_clears_zero) {
    registers.a = 0b11000011;
    registers.p = Z_FLAG;
    expected.a = 0b11000001;
    expected.p = N_FLAG;
    memory_content = 0b11110001;

    run_read_instruction(AND_ABS);
}